

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaAccuracy.cpp
# Opt level: O0

void __thiscall glcts::GPUShader5FmaAccuracyTest::deinit(GPUShader5FmaAccuracyTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GPUShader5FmaAccuracyTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(0);
  (**(code **)(lVar3 + 0xd8))(0);
  (**(code **)(lVar3 + 0x48))(0x8c8e,0);
  (**(code **)(lVar3 + 0x40))(0x8892,0);
  if (this->m_vertex_array_object_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vertex_array_object_id);
    this->m_vertex_array_object_id = 0;
  }
  if (this->m_buffer_object_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_buffer_object_id);
    this->m_buffer_object_id = 0;
  }
  if (this->m_program_object_id_for_fma_pass != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_program_object_id_for_fma_pass);
    this->m_program_object_id_for_fma_pass = 0;
  }
  if (this->m_program_object_id_for_float_pass != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_program_object_id_for_float_pass);
    this->m_program_object_id_for_float_pass = 0;
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fragment_shader_id);
    this->m_fragment_shader_id = 0;
  }
  if (this->m_vertex_shader_id_for_fma_pass != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vertex_shader_id_for_fma_pass);
    this->m_vertex_shader_id_for_fma_pass = 0;
  }
  if (this->m_vertex_shader_id_for_float_pass != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vertex_shader_id_for_float_pass);
    this->m_vertex_shader_id_for_float_pass = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GPUShader5FmaAccuracyTest::deinit()
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind default values */
	gl.useProgram(0);
	gl.bindVertexArray(0);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, 0 /* id */);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	/* Delete everything */
	if (0 != m_vertex_array_object_id)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);

		m_vertex_array_object_id = 0;
	}

	if (0 != m_buffer_object_id)
	{
		gl.deleteBuffers(1, &m_buffer_object_id);

		m_buffer_object_id = 0;
	}

	if (0 != m_program_object_id_for_fma_pass)
	{
		gl.deleteProgram(m_program_object_id_for_fma_pass);

		m_program_object_id_for_fma_pass = 0;
	}

	if (0 != m_program_object_id_for_float_pass)
	{
		gl.deleteProgram(m_program_object_id_for_float_pass);

		m_program_object_id_for_float_pass = 0;
	}

	if (0 != m_fragment_shader_id)
	{
		gl.deleteShader(m_fragment_shader_id);

		m_fragment_shader_id = 0;
	}

	if (0 != m_vertex_shader_id_for_fma_pass)
	{
		gl.deleteShader(m_vertex_shader_id_for_fma_pass);

		m_vertex_shader_id_for_fma_pass = 0;
	}

	if (0 != m_vertex_shader_id_for_float_pass)
	{
		gl.deleteShader(m_vertex_shader_id_for_float_pass);

		m_vertex_shader_id_for_float_pass = 0;
	}

	/* Call base class' deinit() */
	TestCaseBase::deinit();
}